

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.cpp
# Opt level: O3

void __thiscall Paragraph::print(Paragraph *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  puts((this->super_Section)._text);
  ppPVar1 = (this->_sections).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar2 = (this->_sections).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1; ppPVar2 = ppPVar2 + 1
      ) {
    if (*ppPVar2 != (Paragraph *)0x0) {
      (*((*ppPVar2)->super_Section)._vptr_Section[2])();
      ppPVar1 = (this->_sections).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void Paragraph::print()
{
	printf("%s\n", _text);

	vector<Paragraph*>::iterator iter = _sections.begin();
	for (; iter != _sections.end(); ++iter) {
		if (*iter)
			(*iter)->print();
	}
}